

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::AddFundamentalParameterData
          (IFF_Layer2 *this,IFF_ATC_NAVAIDS_FundamentalParameterData *FPD)

{
  KUINT16 *pKVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  KFLOAT32 KVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  pointer pIVar7;
  
  __position._M_current =
       (this->m_vFPD).
       super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vFPD).
      super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>>
    ::_M_realloc_insert<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_const&>
              ((vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>>
                *)&this->m_vFPD,__position,FPD);
    pIVar7 = (this->m_vFPD).
             super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
         (_func_int **)&PTR__IFF_ATC_NAVAIDS_FundamentalParameterData_00233ba8;
    KVar4 = FPD->m_f32Freq;
    KVar5 = FPD->m_f32PgRF;
    KVar6 = FPD->m_f32PulseWidth;
    uVar2 = *(undefined8 *)((long)&FPD->m_f32PgRF + 1);
    uVar3 = *(undefined8 *)((long)&FPD->m_ui32BurstLength + 1);
    (__position._M_current)->m_f32ERP = FPD->m_f32ERP;
    (__position._M_current)->m_f32Freq = KVar4;
    (__position._M_current)->m_f32PgRF = KVar5;
    (__position._M_current)->m_f32PulseWidth = KVar6;
    *(undefined8 *)((long)&(__position._M_current)->m_f32PgRF + 1) = uVar2;
    *(undefined8 *)((long)&(__position._M_current)->m_ui32BurstLength + 1) = uVar3;
    pIVar7 = (this->m_vFPD).
             super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_vFPD).
    super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  pKVar1 = &(this->super_LayerHeader).m_ui16LayerLength;
  *pKVar1 = *pKVar1 + 0x18;
  SecondaryOperationalData::SetNumberOfFundamentalParamSets
            (&this->m_SOD,
             (char)((uint)((int)pIVar7 -
                          *(int *)&(this->m_vFPD).
                                   super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33);
  return;
}

Assistant:

void IFF_Layer2::AddFundamentalParameterData( const IFF_ATC_NAVAIDS_FundamentalParameterData & FPD )
{
    m_vFPD.push_back( FPD );
    m_ui16LayerLength += IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE;
    m_SOD.SetNumberOfFundamentalParamSets( m_vFPD.size() );
}